

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O2

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (ushort)*dt;
  if (uVar1 < 0x20) {
    uVar5 = bitD->bitsConsumed + (uint)uVar1;
    bitD->bitsConsumed = uVar5;
    DStatePtr->state = ~(-1L << ((byte)uVar1 & 0x3f)) & bitD->bitContainer >> (-(char)uVar5 & 0x3fU)
    ;
    if (uVar5 < 0x41) {
      pcVar2 = bitD->ptr;
      if (pcVar2 < bitD->limitPtr) {
        pcVar3 = bitD->start;
        if (pcVar2 != pcVar3) {
          uVar4 = (int)pcVar2 - (int)pcVar3;
          if (pcVar3 <= pcVar2 + -(ulong)(uVar5 >> 3)) {
            uVar4 = uVar5 >> 3;
          }
          bitD->ptr = pcVar2 + -(ulong)uVar4;
          bitD->bitsConsumed = uVar5 + uVar4 * -8;
          bitD->bitContainer = *(size_t *)(pcVar2 + -(ulong)uVar4);
        }
      }
      else {
        BIT_reloadDStreamFast(bitD);
      }
    }
    DStatePtr->table = dt + 1;
    return;
  }
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}